

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_env.h
# Opt level: O2

void __thiscall Rule::Rule(Rule *this,string *name)

{
  _Rb_tree_header *p_Var1;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  p_Var1 = &(this->bindings_)._M_t._M_impl.super__Rb_tree_header;
  (this->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->bindings_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

explicit Rule(const std::string& name) : name_(name) {}